

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::RelayTransaction
          (PeerManagerImpl *this,uint256 *txid,uint256 *wtxid)

{
  long lVar1;
  Peer *this_00;
  bool bVar2;
  TxRelay *pTVar3;
  _Base_ptr p_Var4;
  uint256 *__v;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock48,&this->m_peer_mutex,"m_peer_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x938,false);
  for (p_Var4 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    this_00 = (Peer *)p_Var4[1]._M_parent;
    pTVar3 = Peer::GetTxRelay(this_00);
    if (pTVar3 != (TxRelay *)0x0) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 &criticalblock49.super_unique_lock,&pTVar3->m_tx_inventory_mutex,
                 "tx_relay->m_tx_inventory_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                 ,0x93e,false);
      if ((pTVar3->m_next_inv_send_time).__r != 0) {
        __v = txid;
        if (((this_00->m_wtxid_relay)._M_base._M_i & 1U) != 0) {
          __v = wtxid;
        }
        vKey.m_size = 0x20;
        vKey.m_data = (uchar *)__v;
        bVar2 = CRollingBloomFilter::contains(&pTVar3->m_tx_inventory_known_filter,vKey);
        if (!bVar2) {
          std::
          _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
          ::_M_insert_unique<uint256_const&>
                    ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                      *)&pTVar3->m_tx_inventory_to_send,__v);
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock49.super_unique_lock);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock48.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::RelayTransaction(const uint256& txid, const uint256& wtxid)
{
    LOCK(m_peer_mutex);
    for(auto& it : m_peer_map) {
        Peer& peer = *it.second;
        auto tx_relay = peer.GetTxRelay();
        if (!tx_relay) continue;

        LOCK(tx_relay->m_tx_inventory_mutex);
        // Only queue transactions for announcement once the version handshake
        // is completed. The time of arrival for these transactions is
        // otherwise at risk of leaking to a spy, if the spy is able to
        // distinguish transactions received during the handshake from the rest
        // in the announcement.
        if (tx_relay->m_next_inv_send_time == 0s) continue;

        const uint256& hash{peer.m_wtxid_relay ? wtxid : txid};
        if (!tx_relay->m_tx_inventory_known_filter.contains(hash)) {
            tx_relay->m_tx_inventory_to_send.insert(hash);
        }
    };
}